

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O0

void __thiscall
powerpc_test_cpu::test_instruction_CRR__(powerpc_test_cpu *this,char *insn,uint32_t opcode)

{
  uint32_t a1;
  uint32_t a2;
  int iVar1;
  int local_40;
  uint32_t rb;
  int j;
  uint32_t ra;
  int i;
  int k;
  int n_values;
  uint32_t local_1c;
  char *pcStack_18;
  uint32_t opcode_local;
  char *insn_local;
  powerpc_test_cpu *this_local;
  
  local_1c = opcode;
  pcStack_18 = insn;
  insn_local = (char *)this;
  if (test_instruction_CRR__(char_const*,unsigned_int)::code == '\0') {
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      test_instruction_CRR__::code[0] = 0;
      test_instruction_CRR__::code[1] = 0x4e800020;
      test_instruction_CRR__::code[2] = POWERPC_MR(0,4);
      test_instruction_CRR__::code[3] = 0;
      test_instruction_CRR__::code[4] = 0x4e800020;
      __cxa_guard_release(&test_instruction_CRR__(char_const*,unsigned_int)::code);
    }
  }
  for (ra = 0; (int)ra < 8; ra = ra + 1) {
    bit_field<6,_8>::insert(&local_1c,ra);
    test_instruction_CRR__::code[3] = local_1c;
    test_instruction_CRR__::code[0] = local_1c;
    bit_field<11,_15>::insert(test_instruction_CRR__::code + 3,0);
    flush_icache_range(this,test_instruction_CRR__::code,0x14);
    for (j = 0; j < 0x24; j = j + 1) {
      a1 = reg_values[j];
      for (local_40 = 0; local_40 < 0x24; local_40 = local_40 + 1) {
        a2 = reg_values[local_40];
        test_one(this,test_instruction_CRR__::code,pcStack_18,a1,a2,0,0);
        test_one(this,test_instruction_CRR__::code + 2,pcStack_18,a1,a2,0,0);
      }
    }
  }
  return;
}

Assistant:

void powerpc_test_cpu::test_instruction_CRR__(const char *insn, uint32_t opcode)
{
	// Test code
	static uint32_t code[] = {
		POWERPC_ILLEGAL, POWERPC_BLR,
		POWERPC_MR(0, RA), POWERPC_ILLEGAL, POWERPC_BLR
	};

	// Input values
	const int n_values = sizeof(reg_values)/sizeof(reg_values[0]);

	for (int k = 0; k < 8; k++) {
		crfD_field::insert(opcode, k);
		code[0] = code[3] = opcode;			// <op> crfD,RA,RB
		rA_field::insert(code[3], 0);		// <op> crfD,R0,RB
		flush_icache_range(code, sizeof(code));
		for (int i = 0; i < n_values; i++) {
			const uint32_t ra = reg_values[i];
			for (int j = 0; j < n_values; j++) {
			const uint32_t rb = reg_values[j];
			test_one(&code[0], insn, ra, rb, 0);
			test_one(&code[2], insn, ra, rb, 0);
			}
		}
	}
}